

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall
args::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  char __rhs;
  undefined1 *puVar1;
  _Alloc_hider _Var2;
  int iVar3;
  OptionType OVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  ulong uVar6;
  undefined4 extraout_var_01;
  undefined8 uVar7;
  Matcher *this_01;
  EitherFlag *this_02;
  pointer __rhs_00;
  iterator __end6;
  iterator __begin6;
  string *choice;
  bool bVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  string arg;
  vector<args::FlagBase_*,_std::allocator<args::FlagBase_*>_> flags;
  vector<args::Command_*,_std::allocator<args::Command_*>_> commands;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [24];
  undefined1 local_d0 [32];
  string *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long local_78;
  long *local_70;
  long *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  long *local_48;
  long *local_40;
  long *plVar5;
  
  if ((this->readCompletion & it._M_current + 1 == end._M_current) == 0) {
    return false;
  }
  iVar3 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(&local_48,this);
  OVar4 = ParseOption(this,it._M_current,true);
  if (local_48 == local_40) {
    if ((plVar5 != (long *)0x0) && ((*(byte *)(plVar5 + 1) & 0x40) == 0)) {
      if ((char)plVar5[0x13] == '\x01') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(plVar5 + 0x10));
      }
      else {
        (**(code **)(*plVar5 + 0x80))(local_100,plVar5,&this->helpParams);
      }
      _Var2._M_p = local_f8._M_p;
      choice = (string *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
      bVar8 = choice == (string *)local_f8._M_p;
      for (; choice != (string *)_Var2._M_p; choice = choice + 1) {
        AddCompletionReply(this,it._M_current,choice);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if (OVar4 == Positional && bVar8) goto LAB_001110a3;
    }
  }
  else {
    plVar5 = local_48;
    if ((OVar4 == Positional) || ((it._M_current)->_M_string_length == 0)) {
      do {
        if ((*(byte *)(*plVar5 + 8) & 0x40) == 0) {
          AddCompletionReply(this,it._M_current,(string *)(*plVar5 + 0x68));
        }
        plVar5 = plVar5 + 1;
      } while (plVar5 != local_40);
      goto LAB_001110a3;
    }
    do {
      if ((*(byte *)(*plVar5 + 8) & 0x40) == 0) {
        AddCompletionReply(this,it._M_current,(string *)(*plVar5 + 0x68));
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != local_40);
  }
  (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&local_88,this);
  local_70 = (long *)local_88._8_8_;
  if (local_88._M_allocated_capacity != local_88._8_8_) {
    local_e8._16_8_ = &this->shortprefix;
    local_b0 = &this->longprefix;
    uVar7 = local_88._M_allocated_capacity;
    do {
      local_68 = (long *)uVar7;
      if ((*(byte *)(*(long *)uVar7 + 8) & 0x40) == 0) {
        this_01 = (Matcher *)(*(long *)uVar7 + 0xa0);
        Matcher::GetShortOrAny((EitherFlag *)local_100,this_01);
        EitherFlag::str((string *)local_d0,(EitherFlag *)local_100,(string *)local_e8._16_8_,
                        local_b0);
        bVar8 = AddCompletionReply(this,it._M_current,(string *)local_d0);
        if ((EitherFlag *)local_d0._0_8_ != (EitherFlag *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        if ((string *)local_f8._M_p != (string *)local_e8) {
          operator_delete(local_f8._M_p,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
        }
        if (!bVar8) {
          Matcher::GetFlagStrings
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_d0,this_01
                    );
          uVar7 = local_d0._8_8_;
          this_02 = (EitherFlag *)local_d0._0_8_;
          if (local_d0._0_8_ != local_d0._8_8_) {
            do {
              EitherFlag::str((string *)local_100,this_02,(string *)local_e8._16_8_,local_b0);
              bVar8 = AddCompletionReply(this,it._M_current,(string *)local_100);
              puVar1 = (undefined1 *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
              if (puVar1 != local_f0) {
                operator_delete(puVar1,(ulong)((long)local_f0 + 1));
              }
              this_02 = this_02 + 1;
            } while (!bVar8 && this_02 != (EitherFlag *)uVar7);
          }
          std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector
                    ((vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *)local_d0);
        }
      }
      uVar7 = local_68 + 1;
    } while ((long *)uVar7 != local_70);
  }
  if (OVar4 == LongFlag) {
    if ((this->allowJoinedLongValue == true) && ((this->longseparator)._M_string_length != 0)) {
      local_e8._16_8_ = &this->longseparator;
      uVar6 = std::__cxx11::string::find
                        ((char *)it._M_current,
                         (ulong)(((string *)local_e8._16_8_)->_M_dataplus)._M_p,0);
      if (uVar6 != 0xffffffffffffffff) {
LAB_00111102:
        std::__cxx11::string::string((string *)local_d0,(string *)it._M_current,0,uVar6);
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_d0);
        local_100[0] = false;
        local_100[1] = '\0';
        local_f8._M_p = (pointer)local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_a8._M_allocated_capacity,
                   local_a8._8_8_ + local_a8._M_allocated_capacity);
        iVar3 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_100);
        plVar5 = (long *)CONCAT44(extraout_var_01,iVar3);
        if ((string *)local_f8._M_p != (string *)local_e8) {
          operator_delete(local_f8._M_p,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_allocated_capacity != &local_98) {
          operator_delete((void *)local_a8._M_allocated_capacity,local_98._M_allocated_capacity + 1)
          ;
        }
        if (plVar5 != (long *)0x0) {
          if ((char)plVar5[0x13] == '\x01') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_60,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(plVar5 + 0x10));
          }
          else {
            (**(code **)(*plVar5 + 0x80))(&local_60,plVar5,&this->helpParams);
          }
          if (local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __rhs_00 = local_60.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            do {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_e8._16_8_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a8,__rhs_00);
              AddCompletionReply(this,it._M_current,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_100);
              puVar1 = (undefined1 *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
              if (puVar1 != local_f0) {
                operator_delete(puVar1,(ulong)((long)local_f0 + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_allocated_capacity != &local_98) {
                operator_delete((void *)local_a8._M_allocated_capacity,
                                local_98._M_allocated_capacity + 1);
              }
              __rhs_00 = __rhs_00 + 1;
            } while (__rhs_00 !=
                     local_60.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
        }
        if ((EitherFlag *)local_d0._0_8_ != (EitherFlag *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
      }
    }
  }
  else if ((OVar4 == ShortFlag) && (this->allowJoinedShortValue == true)) {
    uVar6 = (this->shortprefix)._M_string_length;
    if (uVar6 + 1 < (it._M_current)->_M_string_length) {
      if ((it._M_current)->_M_string_length <= uVar6) {
        uVar6 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
        goto LAB_00111102;
      }
      __rhs = ((it._M_current)->_M_dataplus)._M_p[uVar6];
      local_100[0] = true;
      local_f0 = (undefined1  [8])0x0;
      local_e8[0] = '\0';
      local_100[1] = __rhs;
      local_f8._M_p = (pointer)local_e8;
      iVar3 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_100);
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
      if ((string *)local_f8._M_p != (string *)local_e8) {
        operator_delete(local_f8._M_p,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
      }
      if (plVar5 != (long *)0x0) {
        if ((char)plVar5[0x13] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(plVar5 + 0x10));
        }
        else {
          (**(code **)(*plVar5 + 0x80))(&local_a8,plVar5,&this->helpParams);
        }
        local_e8._16_8_ = local_a8._8_8_;
        if (local_a8._M_allocated_capacity != local_a8._8_8_) {
          local_b0 = &this->shortprefix;
          uVar7 = local_a8._M_allocated_capacity;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0,local_b0,__rhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)uVar7);
            AddCompletionReply(this,it._M_current,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_100);
            puVar1 = (undefined1 *)CONCAT62(local_100._2_6_,CONCAT11(local_100[1],local_100[0]));
            if (puVar1 != local_f0) {
              operator_delete(puVar1,(ulong)((long)local_f0 + 1));
            }
            if ((EitherFlag *)local_d0._0_8_ != (EitherFlag *)(local_d0 + 0x10)) {
              operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
            }
            uVar7 = uVar7 + 0x20;
          } while (uVar7 != local_e8._16_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
      }
    }
  }
  if ((long *)local_88._M_allocated_capacity != (long *)0x0) {
    operator_delete((void *)local_88._M_allocated_capacity,local_78 - local_88._0_8_);
  }
LAB_001110a3:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  CompletionFlag::Get_abi_cxx11_((string *)local_100,this->completion);
  std::runtime_error::runtime_error(this_00,(string *)local_100);
  *(undefined ***)this_00 = &PTR__runtime_error_00136940;
  __cxa_throw(this_00,&Completion::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }